

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

void __thiscall
TestParser_TestException_Test::~TestParser_TestException_Test(TestParser_TestException_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestParser, TestException){
    cout << R"(
                ----- test_exception ------
            )" << endl;
    string buff = R"((-
                    (]
                    -=
                    =-
                    ++
                    --
                    /)
                    -+
                    )-
                    --
                    !)
                    ()";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto program = parser->parseProgram();
    EXPECT_TRUE(parser->hasErrors());
    EXPECT_TRUE(program->Stmts.empty());
    cout << program << endl;
}